

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O1

void Ivy_ManHaigPostprocess(Ivy_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  char *__s;
  int nChoices;
  uint local_1c;
  
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                  ,0x162,"void Ivy_ManHaigPostprocess(Ivy_Man_t *, int)");
  }
  if (fVerbose != 0) {
    printf("Final    : ");
    Ivy_ManPrintStats(p);
    printf("HAIG     : ");
    Ivy_ManPrintStats(p->pHaig);
    uVar1 = Ivy_ManHaigCountChoices(p,(int *)&local_1c);
    printf("Total choice nodes = %d. Total choices = %d. Skipped classes = %d.\n",(ulong)uVar1,
           (ulong)local_1c,(ulong)(uint)p->pHaig->nClassesSkip);
  }
  iVar2 = Ivy_ManIsAcyclic(p->pHaig);
  if (iVar2 == 0 || fVerbose != 0) {
    __s = "HAIG is acyclic";
    if (iVar2 == 0) {
      __s = "HAIG contains a cycle";
    }
    puts(__s);
    return;
  }
  return;
}

Assistant:

void Ivy_ManHaigPostprocess( Ivy_Man_t * p, int fVerbose )
{
    int nChoices, nChoiceNodes;

    assert( p->pHaig != NULL );

    if ( fVerbose )
    {
        printf( "Final    : " );
        Ivy_ManPrintStats( p );
        printf( "HAIG     : " );
        Ivy_ManPrintStats( p->pHaig );

        // print choice node stats
        nChoiceNodes = Ivy_ManHaigCountChoices( p, &nChoices );
        printf( "Total choice nodes = %d. Total choices = %d. Skipped classes = %d.\n", 
            nChoiceNodes, nChoices, p->pHaig->nClassesSkip ); 
    }

    if ( Ivy_ManIsAcyclic( p->pHaig ) )
    {
        if ( fVerbose )
            printf( "HAIG is acyclic\n" );
    }
    else
        printf( "HAIG contains a cycle\n" );

//    if ( fVerbose )
//        Ivy_ManHaigSimulate( p );
}